

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

void __thiscall
Js::DynamicProfileInfo::SetHasNewPolyFieldAccess
          (DynamicProfileInfo *this,FunctionBody *functionBody)

{
  bool bVar1;
  uint sourceContextId;
  LocalFunctionId functionId;
  ScriptContext *pSVar2;
  uint32 uVar3;
  
  pSVar2 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  uVar3 = pSVar2->threadContext->polymorphicCacheState + 1;
  pSVar2->threadContext->polymorphicCacheState = uVar3;
  this->polymorphicCacheState = uVar3;
  sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
  functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01453738,ObjTypeSpecPhase,sourceContextId,functionId);
  if (bVar1) {
    Output::Print(L"New profile cache state: %d\n",(ulong)this->polymorphicCacheState);
    Output::Flush();
    return;
  }
  return;
}

Assistant:

void DynamicProfileInfo::SetHasNewPolyFieldAccess(FunctionBody *functionBody)
    {
        this->polymorphicCacheState = functionBody->GetScriptContext()->GetThreadContext()->GetNextPolymorphicCacheState();

        PHASE_PRINT_TRACE(
            Js::ObjTypeSpecPhase, functionBody,
            _u("New profile cache state: %d\n"), this->polymorphicCacheState);
    }